

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O2

void NHandyPack::
     TVectorSerializer<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_wchar_t>
     ::Dump(ostream *out,
           basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *object)

{
  wchar_t *obj;
  pointer object_00;
  long lVar1;
  undefined1 local_24 [8];
  uint32_t size;
  
  std::ostream::write((char *)out,(long)local_24);
  object_00 = (object->_M_dataplus)._M_p;
  for (lVar1 = object->_M_string_length << 2; lVar1 != 0; lVar1 = lVar1 + -4) {
    TPodSerializer<wchar_t>::Dump(out,object_00);
    object_00 = object_00 + 1;
  }
  return;
}

Assistant:

static inline void Dump(std::ostream& out, const TVec& object) {
        uint32_t size = object.size();
        out.write((const char*)(&size), sizeof(size));
        for (const auto& obj: object) {
            NHandyPack::Dump(out, obj);
        }
    }